

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zeroize.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int c;
  char *end;
  char *p;
  char buf [1024];
  FILE *fp;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  end = (char *)&p;
  if (argc == 2) {
    buf._1016_8_ = fopen(argv[1],"r");
    if ((FILE *)buf._1016_8_ == (FILE *)0x0) {
      printf("Could not open file \'%s\'\n",argv[1]);
      argv_local._4_4_ = 1;
    }
    else {
      while (iVar1 = fgetc((FILE *)buf._1016_8_), iVar1 != -1 && end < buf + 0x3f7) {
        *end = (char)iVar1;
        end = end + 1;
      }
      *end = '\0';
      if ((char **)end == &p) {
        printf("The file is empty!\n");
      }
      else {
        printf("%s\n",&p);
      }
      fp._4_4_ = (uint)((char **)end == &p);
      fclose((FILE *)buf._1016_8_);
      mbedtls_platform_zeroize(&p,0x400);
      argv_local._4_4_ = fp._4_4_;
    }
  }
  else {
    printf("This program takes exactly 1 agument\n");
    usage();
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv )
{
    int exit_code = MBEDTLS_EXIT_FAILURE;
    FILE *fp;
    char buf[BUFFER_LEN];
    char *p = buf;
    char *end = p + BUFFER_LEN;
    int c;

    if( argc != 2 )
    {
        mbedtls_printf( "This program takes exactly 1 agument\n" );
        usage();
        return( exit_code );
    }

    fp = fopen( argv[1], "r" );
    if( fp == NULL )
    {
        mbedtls_printf( "Could not open file '%s'\n", argv[1] );
        return( exit_code );
    }

    while( ( c = fgetc( fp ) ) != EOF && p < end - 1 )
        *p++ = (char)c;
    *p = '\0';

    if( p - buf != 0 )
    {
        mbedtls_printf( "%s\n", buf );
        exit_code = MBEDTLS_EXIT_SUCCESS;
    }
    else
        mbedtls_printf( "The file is empty!\n" );

    fclose( fp );
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( exit_code );
}